

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O3

double despot::POMCP::Simulate
                 (State *particle,RandomStreams *streams,VNode *vnode,DSPOMDP *model,
                 POMCPPrior *prior)

{
  bool bVar1;
  uint action;
  int iVar2;
  log_ostream *plVar3;
  ostream *poVar4;
  long *plVar5;
  QNode *this;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *this_00;
  mapped_type *ppVVar6;
  VNode *pVVar7;
  double dVar8;
  double reward;
  OBS_TYPE obs;
  double local_58;
  VNode *local_50;
  DSPOMDP *local_48;
  key_type local_40;
  double local_38;
  
  local_48 = model;
  bVar1 = RandomStreams::Exhausted(streams);
  dVar8 = 0.0;
  if (!bVar1) {
    action = UpperBoundAction(vnode,prior->exploration_constant_);
    iVar2 = logging::level();
    local_50 = vnode;
    if (0 < iVar2) {
      iVar2 = logging::level();
      if (3 < iVar2) {
        plVar3 = logging::stream(4);
        poVar4 = despot::operator<<(&plVar3->super_ostream,particle);
        std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
        vnode = local_50;
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
    }
    iVar2 = logging::level();
    if (0 < iVar2) {
      iVar2 = logging::level();
      if (3 < iVar2) {
        plVar3 = logging::stream(4);
        std::__ostream_insert<char,std::char_traits<char>>(&plVar3->super_ostream,"depth = ",8);
        iVar2 = VNode::depth(local_50);
        poVar4 = (ostream *)std::ostream::operator<<(plVar3,iVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"; action = ",0xb);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,action);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"; ",2);
        plVar5 = (long *)std::ostream::operator<<(poVar4,particle->scenario_id);
        std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
        vnode = local_50;
        std::ostream::put((char)plVar5);
        std::ostream::flush();
      }
    }
    RandomStreams::Entry(streams,particle->scenario_id);
    iVar2 = (*local_48->_vptr_DSPOMDP[2])(local_48,particle,(ulong)action,&local_58,&local_40);
    this = VNode::Child(vnode,action);
    if ((char)iVar2 == '\0') {
      (*prior->_vptr_POMCPPrior[6])(prior,(ulong)action,local_40);
      RandomStreams::Advance(streams);
      this_00 = QNode::children(this);
      ppVVar6 = std::
                map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                ::operator[](this_00,&local_40);
      pVVar7 = local_50;
      local_38 = DAT_00192dc8;
      if (*ppVVar6 == (mapped_type)0x0) {
        iVar2 = VNode::depth(local_50);
        dVar8 = Rollout(particle,streams,iVar2 + 1,local_48,prior);
        local_58 = local_38 * dVar8 + local_58;
        iVar2 = VNode::depth(pVVar7);
        pVVar7 = CreateVNode(iVar2 + 1,particle,prior,local_48);
        ppVVar6 = std::
                  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                  ::operator[](this_00,&local_40);
        *ppVVar6 = pVVar7;
      }
      else {
        ppVVar6 = std::
                  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                  ::operator[](this_00,&local_40);
        dVar8 = Simulate(particle,streams,*ppVVar6,local_48,prior);
        local_58 = local_38 * dVar8 + local_58;
      }
      RandomStreams::Back(streams);
      (*prior->_vptr_POMCPPrior[7])(prior);
    }
    QNode::Add(this,local_58);
    VNode::Add(local_50,local_58);
    dVar8 = local_58;
  }
  return dVar8;
}

Assistant:

double POMCP::Simulate(State* particle, RandomStreams& streams, VNode* vnode,
	const DSPOMDP* model, POMCPPrior* prior) {
	if (streams.Exhausted())
		return 0;

	double explore_constant = prior->exploration_constant();

	ACT_TYPE action = POMCP::UpperBoundAction(vnode, explore_constant);
	logd << *particle << endl;
	logd << "depth = " << vnode->depth() << "; action = " << action << "; "
		<< particle->scenario_id << endl;

	double reward;
	OBS_TYPE obs;
	bool terminal = model->Step(*particle, streams.Entry(particle->scenario_id),
		action, reward, obs);

	QNode* qnode = vnode->Child(action);
	if (!terminal) {
		prior->Add(action, obs);
		streams.Advance();
		map<OBS_TYPE, VNode*>& vnodes = qnode->children();
		if (vnodes[obs] != NULL) {
			reward += Globals::Discount()
				* Simulate(particle, streams, vnodes[obs], model, prior);
		} else { // Rollout upon encountering a node not in curren tree, then add the node
			reward += Globals::Discount() 
        * Rollout(particle, streams, vnode->depth() + 1, model, prior);
			vnodes[obs] = CreateVNode(vnode->depth() + 1, particle, prior,
				model);
		}
		streams.Back();
		prior->PopLast();
	}

	qnode->Add(reward);
	vnode->Add(reward);

	return reward;
}